

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O0

int err_load_message_file
              (osfildef *fp,err_msg_t **arr,size_t *arr_size,err_msg_t *default_arr,
              size_t default_arr_size)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  unsigned_long uVar4;
  size_t __size;
  size_t sVar5;
  ulong *in_RDX;
  long *in_RSI;
  FILE *in_RDI;
  size_t len2;
  size_t len1;
  err_msg_t *msg;
  size_t i;
  char buf [128];
  undefined4 *in_stack_ffffffffffffff38;
  err_msg_t *in_stack_ffffffffffffff40;
  size_t *in_stack_ffffffffffffff48;
  err_msg_t **in_stack_ffffffffffffff50;
  
  sVar2 = fread(&stack0xffffffffffffff48,0x16,1,in_RDI);
  if ((sVar2 == 1) &&
     (iVar1 = memcmp(&stack0xffffffffffffff48,"TADS3.Message.0001\n\r\x1a",0x16), iVar1 == 0)) {
    err_delete_message_array
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (size_t)in_stack_ffffffffffffff38);
    sVar2 = fread(&stack0xffffffffffffff48,2,1,in_RDI);
    if (sVar2 == 1) {
      iVar1 = osrp2(&stack0xffffffffffffff48);
      *in_RDX = (long)iVar1;
      pvVar3 = malloc(*in_RDX * 0x18);
      *in_RSI = (long)pvVar3;
      if (*in_RSI != 0) {
        memset((void *)*in_RSI,0,*in_RDX * 0x18);
        in_stack_ffffffffffffff40 = (err_msg_t *)0x0;
        in_stack_ffffffffffffff38 = (undefined4 *)*in_RSI;
        while( true ) {
          if ((err_msg_t *)*in_RDX <= in_stack_ffffffffffffff40) {
            return 0;
          }
          sVar2 = fread(&stack0xffffffffffffff48,8,1,in_RDI);
          if (sVar2 != 1) break;
          uVar4 = osrp4(&stack0xffffffffffffff48);
          *in_stack_ffffffffffffff38 = (int)uVar4;
          iVar1 = osrp2(&stack0xffffffffffffff4c);
          sVar2 = (size_t)iVar1;
          iVar1 = osrp2(&stack0xffffffffffffff4e);
          __size = (size_t)iVar1;
          pvVar3 = malloc(sVar2 + 1);
          *(void **)(in_stack_ffffffffffffff38 + 2) = pvVar3;
          pvVar3 = malloc(__size + 1);
          *(void **)(in_stack_ffffffffffffff38 + 4) = pvVar3;
          if ((((*(long *)(in_stack_ffffffffffffff38 + 2) == 0) ||
               (*(long *)(in_stack_ffffffffffffff38 + 4) == 0)) ||
              (sVar5 = fread(*(void **)(in_stack_ffffffffffffff38 + 2),sVar2,1,in_RDI), sVar5 != 1))
             || (sVar5 = fread(*(void **)(in_stack_ffffffffffffff38 + 4),__size,1,in_RDI),
                sVar5 != 1)) break;
          *(undefined1 *)(*(long *)(in_stack_ffffffffffffff38 + 2) + sVar2) = 0;
          *(undefined1 *)(*(long *)(in_stack_ffffffffffffff38 + 4) + __size) = 0;
          in_stack_ffffffffffffff40 = (err_msg_t *)((long)&in_stack_ffffffffffffff40->msgnum + 1);
          in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 + 6;
        }
      }
    }
  }
  err_delete_message_array
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (size_t)in_stack_ffffffffffffff38);
  return 1;
}

Assistant:

int err_load_message_file(osfildef *fp,
                          const err_msg_t **arr, size_t *arr_size,
                          const err_msg_t *default_arr,
                          size_t default_arr_size)
{
    char buf[128];
    size_t i;
    err_msg_t *msg;
    
    /* read the file signature */
    if (osfrb(fp, buf, sizeof(VM_MESSAGE_FILE_SIGNATURE))
        || memcmp(buf, VM_MESSAGE_FILE_SIGNATURE,
                  sizeof(VM_MESSAGE_FILE_SIGNATURE)) != 0)
        goto fail;

    /* delete any previously-loaded message array */
    err_delete_message_array(arr, arr_size, default_arr, default_arr_size);

    /* read the message count */
    if (osfrb(fp, buf, 2))
        goto fail;

    /* set the new message count */
    *arr_size = osrp2(buf);

    /* allocate the message array */
    *arr = (err_msg_t *)t3malloc(*arr_size * sizeof(err_msg_t));
    if (*arr == 0)
        goto fail;

    /* clear the memory */
    memset((err_msg_t *)*arr, 0, *arr_size * sizeof(err_msg_t));

    /* read the individual messages */
    for (i = 0, msg = (err_msg_t *)*arr ; i < *arr_size ; ++i, ++msg)
    {
        size_t len1, len2;
        
        /* read the current message ID and the length of the two messages */
        if (osfrb(fp, buf, 8))
            goto fail;

        /* set the message ID */
        msg->msgnum = (int)t3rp4u(buf);

        /* get the short and long mesage lengths */
        len1 = osrp2(buf + 4);
        len2 = osrp2(buf + 6);

        /* allocate buffers */
        msg->short_msgtxt = (char *)t3malloc(len1 + 1);
        msg->long_msgtxt = (char *)t3malloc(len2 + 1);

        /* if either one failed, give up */
        if (msg->short_msgtxt == 0 || msg->long_msgtxt == 0)
            goto fail;

        /* read the two messages */
        if (osfrb(fp, (char *)msg->short_msgtxt, len1)
            || osfrb(fp, (char *)msg->long_msgtxt, len2))
            goto fail;

        /* null-terminate the strings */
        *(char *)(msg->short_msgtxt + len1) = '\0';
        *(char *)(msg->long_msgtxt + len2) = '\0';
    }

    /* success */
    return 0;

fail:
    /* revert back to the built-in array */
    err_delete_message_array(arr, arr_size,
                             default_arr, default_arr_size);

    /* indicate failure */
    return 1;
}